

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyRead.c
# Opt level: O0

char * Abc_FileRead(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  int RetValue;
  int nFileSize;
  char *pBuffer;
  FILE *pFile;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
    pFileName_local = (char *)0x0;
  }
  else {
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    iVar1 = (int)lVar2;
    rewind(__stream);
    pFileName_local = (char *)malloc((long)(iVar1 + 3));
    fread(pFileName_local,(long)iVar1,1,__stream);
    pFileName_local[iVar1] = '\n';
    pFileName_local[iVar1 + 1] = '\n';
    pFileName_local[iVar1 + 2] = '\0';
    fclose(__stream);
  }
  return pFileName_local;
}

Assistant:

static char * Abc_FileRead( char * pFileName )
{
    FILE * pFile;
    char * pBuffer;
    int nFileSize;
    int RetValue;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    nFileSize = ftell( pFile );  
    // move the file current reading position to the beginning
    rewind( pFile ); 
    // load the contents of the file into memory
    pBuffer = (char *)malloc( nFileSize + 3 );
    RetValue = fread( pBuffer, nFileSize, 1, pFile );
    // add several empty lines at the end
    // (these will be used to signal the end of parsing)
    pBuffer[ nFileSize + 0] = '\n';
    pBuffer[ nFileSize + 1] = '\n';
    // terminate the string with '\0'
    pBuffer[ nFileSize + 2] = '\0';
    fclose( pFile );
    return pBuffer;
}